

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

QAction * __thiscall QToolBar::addWidget(QToolBar *this,QWidget *widget)

{
  QAction *action_00;
  QWidgetActionPrivate *pQVar1;
  QWidgetAction *in_RSI;
  QWidget *in_RDI;
  QWidgetAction *action;
  QObject *in_stack_ffffffffffffffe8;
  QAction *pQVar2;
  QWidget *widget_00;
  
  widget_00 = in_RDI;
  action_00 = (QAction *)operator_new(0x10);
  QWidgetAction::QWidgetAction(in_RSI,in_stack_ffffffffffffffe8);
  pQVar2 = action_00;
  QWidgetAction::setDefaultWidget(in_RSI,widget_00);
  pQVar1 = QWidgetAction::d_func((QWidgetAction *)0x6ecc69);
  pQVar1->field_0x1d0 = pQVar1->field_0x1d0 & 0xfd | 2;
  QWidget::addAction(in_RDI,action_00);
  return pQVar2;
}

Assistant:

QAction *QToolBar::addWidget(QWidget *widget)
{
    QWidgetAction *action = new QWidgetAction(this);
    action->setDefaultWidget(widget);
    action->d_func()->autoCreated = true;
    addAction(action);
    return action;
}